

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse2_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  uint uVar2;
  parasail_result_t *ppVar3;
  int64_t *ptr;
  ulong *ptr_00;
  ulong *ptr_01;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  char *__format;
  ulong uVar12;
  uint uVar13;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Da_00;
  uint extraout_XMM0_Da_01;
  uint uVar15;
  undefined8 extraout_XMM0_Qa;
  uint extraout_XMM0_Db;
  undefined8 extraout_XMM0_Qa_00;
  uint extraout_XMM0_Db_00;
  ulong extraout_XMM0_Qa_01;
  uint extraout_XMM0_Db_01;
  ulong extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dc_01;
  undefined8 extraout_XMM0_Qb;
  uint extraout_XMM0_Dd;
  undefined8 extraout_XMM0_Qb_00;
  uint extraout_XMM0_Dd_00;
  ulong extraout_XMM0_Qb_01;
  uint extraout_XMM0_Dd_01;
  ulong extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar14 [16];
  ulong uVar21;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  __m128i_64_t A_1;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  __m128i_64_t A;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  __m128i_64_t B_2;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  uint uVar42;
  uint uVar43;
  __m128i_64_t B_1;
  undefined1 auVar41 [16];
  uint uVar44;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i alVar45;
  int64_t *local_210;
  int iStack_204;
  ulong local_1f8;
  ulong uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_198;
  ulong uStack_190;
  ulong uStack_180;
  undefined1 local_178 [16];
  undefined8 local_168;
  undefined8 uStack_160;
  ulong local_138;
  ulong uStack_130;
  ulong local_128 [4];
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong local_e8 [2];
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  int local_98;
  undefined4 uStack_94;
  int iStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_48 [3];
  parasail_matrix_t *ppVar11;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar6 = "_s2";
  }
  else {
    uVar8 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar6 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar6 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar6 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar6 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        b_00[1] = (ulong)(uint)matrix->length;
LAB_0050c441:
        iVar35 = matrix->min;
        uVar12 = 0x8000000000000000 - (long)iVar35;
        if (iVar35 != -open && SBORROW4(iVar35,-open) == iVar35 + open < 0) {
          uVar12 = (ulong)(uint)open | 0x8000000000000000;
        }
        iVar35 = matrix->max;
        ppVar3 = parasail_result_new();
        if (ppVar3 != (parasail_result_t *)0x0) {
          ppVar3->flag = ppVar3->flag | 0x2801004;
          a[1] = (ulong)(s2Len + 2);
          ptr = parasail_memalign_int64_t(0x10,a[1]);
          ptr_00 = (ulong *)parasail_memalign_int64_t(0x10,a[1]);
          ptr_01 = (ulong *)parasail_memalign_int64_t(0x10,a[1]);
          if (ptr_01 != (ulong *)0x0 && (ptr_00 != (ulong *)0x0 && ptr != (int64_t *)0x0)) {
            iVar7 = (int)b_00[1];
            lVar4 = (long)iVar7;
            if (matrix->type == 0) {
              a[1] = (ulong)(iVar7 + 1);
              local_210 = parasail_memalign_int64_t(0x10,a[1]);
              uVar5 = 0;
              if (local_210 == (int64_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar21 = 0;
              if (0 < iVar7) {
                uVar21 = b_00[1];
              }
              for (; lVar9 = lVar4, uVar21 != uVar5; uVar5 = uVar5 + 1) {
                a[1] = (ulong)(byte)_s1[uVar5];
                local_210[uVar5] = (long)matrix->mapper[a[1]];
              }
              for (; lVar9 <= lVar4; lVar9 = lVar9 + 1) {
                local_210[lVar9] = 0;
              }
            }
            else {
              local_210 = (int64_t *)0x0;
            }
            uVar12 = uVar12 + 1;
            lVar9 = 0x7ffffffffffffffe - (long)iVar35;
            uVar13 = (uint)uVar12;
            uVar15 = (uint)(uVar12 >> 0x20);
            auVar16._8_4_ = uVar13;
            auVar16._0_8_ = uVar12;
            auVar16._12_4_ = uVar15;
            local_108._8_4_ = (int)lVar9;
            local_108._0_8_ = lVar9;
            local_108._12_4_ = (int)((ulong)lVar9 >> 0x20);
            local_c8 = auVar16 >> 0x40;
            local_98 = open;
            uStack_94 = 0;
            iStack_90 = open;
            uStack_8c = 0;
            local_a8._4_4_ = 0;
            local_a8._0_4_ = gap;
            local_a8._8_4_ = gap;
            local_a8._12_4_ = 0;
            iStack_204 = iVar7 >> 0x1f;
            local_d8 = iVar7;
            iStack_d4 = iStack_204;
            iStack_d0 = iVar7;
            iStack_cc = iStack_204;
            local_b8._4_4_ = 0;
            local_b8._0_4_ = s2Len;
            local_b8._8_4_ = s2Len;
            local_b8._12_4_ = 0;
            piVar1 = matrix->mapper;
            for (b_00[1] = 0; uVar8 != b_00[1]; b_00[1] = b_00[1] + 1) {
              ptr[b_00[1] + 1] = (long)piVar1[(byte)_s2[b_00[1]]];
            }
            *ptr = 0;
            for (uVar5 = uVar8; (int)uVar5 <= s2Len; uVar5 = uVar5 + 1) {
              ptr[uVar5 + 1] = 0;
            }
            for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
              ptr_00[uVar5 + 1] = 0;
              ptr_01[uVar5 + 1] = uVar12;
            }
            *ptr_00 = uVar12;
            *ptr_01 = uVar12;
            for (uVar5 = uVar8; (int)uVar5 <= s2Len; uVar5 = uVar5 + 1) {
              ptr_00[uVar5 + 1] = uVar12;
              ptr_01[uVar5 + 1] = uVar12;
            }
            local_178._0_12_ = ZEXT812(1);
            local_178._12_4_ = 0;
            uStack_180 = auVar16._8_8_;
            uStack_130 = uStack_180;
            uStack_190 = uStack_180;
            uStack_1b0 = uStack_180;
            uVar5 = 0;
            local_1b8 = uVar12;
            local_198 = uVar12;
            local_138 = uVar12;
            while ((long)uVar5 < lVar4) {
              if (matrix->type == 0) {
                b_00[1] = local_210[uVar5];
                lVar9 = local_210[uVar5 + 1];
              }
              else {
                uVar2 = (uint)uVar5 | 1;
                if (lVar4 <= (long)(uVar5 | 1)) {
                  uVar2 = iVar7 - 1;
                }
                lVar9 = (long)(int)uVar2;
                b_00[1] = uVar5;
              }
              piVar1 = matrix->matrix;
              a[1] = (ulong)matrix->size;
              b[1] = b_00[1] * a[1];
              lVar9 = lVar9 * a[1];
              a[0] = (longlong)matrix;
              b[0] = (longlong)piVar1;
              b_00[1] = b[1];
              ppVar11 = matrix;
              local_128[3] = uVar5;
              alVar45 = _mm_cmplt_epi64_rpl(a,b);
              local_88 = extraout_XMM0_Qa;
              uStack_80 = extraout_XMM0_Qb;
              uVar10 = 0;
              uStack_160 = uStack_180;
              local_168 = uVar12;
              local_f8 = uVar12;
              uStack_f0 = uStack_180;
              local_1f8 = 0xffffffffffffffff;
              uStack_1f0 = 0;
              local_1c8 = local_c8._0_8_;
              uStack_1c0 = local_c8._8_8_;
              uVar5 = local_c8._0_8_;
              uVar21 = local_c8._8_8_;
              while( true ) {
                b_00[0] = alVar45[1];
                if (uVar8 < uVar10) break;
                uStack_50 = ptr_00[uVar10 + 1];
                auVar27._0_8_ = uStack_1c0 - CONCAT44(uStack_94,local_98);
                auVar27._8_8_ = uStack_50 - CONCAT44(uStack_8c,iStack_90);
                auVar31._0_8_ = CONCAT44(local_f8._4_4_,(undefined4)uStack_f0) - local_a8._0_8_;
                auVar31._8_8_ = ptr_01[uVar10 + 1] - local_a8._8_8_;
                auVar40._0_8_ = local_1c8 - CONCAT44(uStack_94,local_98);
                auVar40._8_8_ = uStack_1c0 - CONCAT44(uStack_8c,iStack_90);
                auVar41._0_8_ = local_168 - local_a8._0_8_;
                auVar41._8_8_ = uStack_160 - local_a8._8_8_;
                b_00[1] = (ulong)piVar1[b[1] + ptr[uVar10 + 1]];
                auVar19._0_8_ = (long)piVar1[lVar9 + ptr[uVar10]] + uVar5;
                auVar19._8_8_ = b_00[1] + uVar21;
                auVar16 = auVar31 ^ _DAT_008a1890;
                auVar29 = auVar27 ^ _DAT_008a1890;
                iVar35 = -(uint)(auVar16._0_4_ < auVar29._0_4_);
                iVar36 = -(uint)(auVar16._4_4_ < auVar29._4_4_);
                iVar37 = -(uint)(auVar16._8_4_ < auVar29._8_4_);
                iVar38 = -(uint)(auVar16._12_4_ < auVar29._12_4_);
                auVar39._4_4_ = iVar35;
                auVar39._0_4_ = iVar35;
                auVar39._8_4_ = iVar37;
                auVar39._12_4_ = iVar37;
                iVar35 = -(uint)(auVar29._4_4_ == auVar16._4_4_);
                iVar37 = -(uint)(auVar29._12_4_ == auVar16._12_4_);
                auVar23._4_4_ = iVar35;
                auVar23._0_4_ = iVar35;
                auVar23._8_4_ = iVar37;
                auVar23._12_4_ = iVar37;
                auVar30._4_4_ = iVar36;
                auVar30._0_4_ = iVar36;
                auVar30._8_4_ = iVar38;
                auVar30._12_4_ = iVar38;
                auVar30 = auVar30 | auVar23 & auVar39;
                auVar31 = ~auVar30 & auVar31 | auVar27 & auVar30;
                auVar16 = auVar41 ^ _DAT_008a1890;
                auVar29 = auVar40 ^ _DAT_008a1890;
                iVar35 = -(uint)(auVar16._0_4_ < auVar29._0_4_);
                iVar36 = -(uint)(auVar16._4_4_ < auVar29._4_4_);
                iVar37 = -(uint)(auVar16._8_4_ < auVar29._8_4_);
                iVar38 = -(uint)(auVar16._12_4_ < auVar29._12_4_);
                auVar32._4_4_ = iVar35;
                auVar32._0_4_ = iVar35;
                auVar32._8_4_ = iVar37;
                auVar32._12_4_ = iVar37;
                iVar35 = -(uint)(auVar29._4_4_ == auVar16._4_4_);
                iVar37 = -(uint)(auVar29._12_4_ == auVar16._12_4_);
                auVar17._4_4_ = iVar35;
                auVar17._0_4_ = iVar35;
                auVar17._8_4_ = iVar37;
                auVar17._12_4_ = iVar37;
                auVar22._4_4_ = iVar36;
                auVar22._0_4_ = iVar36;
                auVar22._8_4_ = iVar38;
                auVar22._12_4_ = iVar38;
                auVar22 = auVar22 | auVar17 & auVar32;
                auVar23 = ~auVar22 & auVar41 | auVar40 & auVar22;
                auVar16 = auVar23 ^ _DAT_008a1890;
                auVar29 = auVar19 ^ _DAT_008a1890;
                iVar35 = -(uint)(auVar16._0_4_ < auVar29._0_4_);
                iVar36 = -(uint)(auVar16._4_4_ < auVar29._4_4_);
                iVar37 = -(uint)(auVar16._8_4_ < auVar29._8_4_);
                iVar38 = -(uint)(auVar16._12_4_ < auVar29._12_4_);
                auVar33._4_4_ = iVar35;
                auVar33._0_4_ = iVar35;
                auVar33._8_4_ = iVar37;
                auVar33._12_4_ = iVar37;
                iVar35 = -(uint)(auVar29._4_4_ == auVar16._4_4_);
                iVar37 = -(uint)(auVar29._12_4_ == auVar16._12_4_);
                auVar18._4_4_ = iVar35;
                auVar18._0_4_ = iVar35;
                auVar18._8_4_ = iVar37;
                auVar18._12_4_ = iVar37;
                auVar24._4_4_ = iVar36;
                auVar24._0_4_ = iVar36;
                auVar24._8_4_ = iVar38;
                auVar24._12_4_ = iVar38;
                auVar24 = auVar24 | auVar18 & auVar33;
                auVar25 = ~auVar24 & auVar23 | auVar19 & auVar24;
                auVar16 = auVar25 ^ _DAT_008a1890;
                auVar19 = auVar31 ^ _DAT_008a1890;
                iVar35 = -(uint)(auVar19._0_4_ < auVar16._0_4_);
                iVar36 = -(uint)(auVar19._4_4_ < auVar16._4_4_);
                iVar37 = -(uint)(auVar19._8_4_ < auVar16._8_4_);
                iVar38 = -(uint)(auVar19._12_4_ < auVar16._12_4_);
                auVar34._4_4_ = iVar35;
                auVar34._0_4_ = iVar35;
                auVar34._8_4_ = iVar37;
                auVar34._12_4_ = iVar37;
                iVar35 = -(uint)(auVar19._4_4_ == auVar16._4_4_);
                iVar37 = -(uint)(auVar19._12_4_ == auVar16._12_4_);
                auVar29._4_4_ = iVar35;
                auVar29._0_4_ = iVar35;
                auVar29._8_4_ = iVar37;
                auVar29._12_4_ = iVar37;
                auVar20._4_4_ = iVar36;
                auVar20._0_4_ = iVar36;
                auVar20._8_4_ = iVar38;
                auVar20._12_4_ = iVar38;
                auVar20 = auVar20 | auVar29 & auVar34;
                auVar19 = ~auVar20 & auVar31 | auVar25 & auVar20;
                auVar16 = auVar19 ^ _DAT_008a1890;
                iVar35 = -(uint)((int)DAT_008a1890 < auVar16._0_4_);
                auVar26._4_4_ = -(uint)(DAT_008a1890._4_4_ < auVar16._4_4_);
                iVar37 = -(uint)(DAT_008a1890._8_4_ < auVar16._8_4_);
                auVar26._12_4_ = -(uint)(DAT_008a1890._12_4_ < auVar16._12_4_);
                auVar28._4_4_ = iVar35;
                auVar28._0_4_ = iVar35;
                auVar28._8_4_ = iVar37;
                auVar28._12_4_ = iVar37;
                auVar25._4_4_ = -(uint)(auVar16._4_4_ == DAT_008a1890._4_4_);
                auVar25._12_4_ = -(uint)(auVar16._12_4_ == DAT_008a1890._12_4_);
                auVar25._0_4_ = auVar25._4_4_;
                auVar25._8_4_ = auVar25._12_4_;
                auVar26._0_4_ = auVar26._4_4_;
                auVar26._8_4_ = auVar26._12_4_;
                auVar19 = (auVar26 | auVar25 & auVar28) & auVar19;
                alVar45[1] = a[1];
                alVar45[0] = (longlong)ppVar11;
                local_58 = uStack_1c0;
                alVar45 = _mm_cmpeq_epi64_rpl(alVar45,b_00);
                b_01[0] = alVar45[1];
                local_1c8._0_4_ = auVar19._0_4_;
                local_1c8._4_4_ = auVar19._4_4_;
                uStack_1c0._0_4_ = auVar19._8_4_;
                uStack_1c0._4_4_ = auVar19._12_4_;
                local_1c8._0_4_ = ~extraout_XMM0_Da & (uint)local_1c8;
                local_1c8._4_4_ = ~extraout_XMM0_Db & local_1c8._4_4_;
                local_168._0_4_ = auVar31._0_4_;
                local_168._4_4_ = auVar31._4_4_;
                uStack_160._0_4_ = auVar31._8_4_;
                uStack_160._4_4_ = auVar31._12_4_;
                uVar43 = ~extraout_XMM0_Dc & (uint)uStack_160;
                uVar44 = ~extraout_XMM0_Dd & uStack_160._4_4_;
                uVar2 = ~extraout_XMM0_Da & (uint)local_168 | extraout_XMM0_Da & uVar13;
                uVar42 = ~extraout_XMM0_Db & local_168._4_4_ | extraout_XMM0_Db & uVar15;
                local_1e8._0_4_ = auVar23._0_4_;
                local_1e8._4_4_ = auVar23._4_4_;
                uStack_1e0._0_4_ = auVar23._8_4_;
                uStack_1e0._4_4_ = auVar23._12_4_;
                uStack_1c0._0_4_ = ~extraout_XMM0_Dc & (uint)uStack_1c0;
                uStack_1c0._4_4_ = ~extraout_XMM0_Dd & uStack_1c0._4_4_;
                local_168._4_4_ = ~extraout_XMM0_Db & local_1e8._4_4_ | extraout_XMM0_Db & uVar15;
                local_168._0_4_ = ~extraout_XMM0_Da & (uint)local_1e8 | extraout_XMM0_Da & uVar13;
                uStack_160._0_4_ = ~extraout_XMM0_Dc & (uint)uStack_1e0 | extraout_XMM0_Dc & uVar13;
                uStack_160._4_4_ = ~extraout_XMM0_Dd & uStack_1e0._4_4_ | extraout_XMM0_Dd & uVar15;
                *(uint *)(ptr_00 + uVar10) = (uint)local_1c8;
                *(uint *)((long)(ptr_00 + uVar10) + 4) = local_1c8._4_4_;
                local_f8 = CONCAT44(uVar42,uVar2);
                uStack_f0 = CONCAT44(uVar44 | extraout_XMM0_Dd & uVar15,
                                     uVar43 | extraout_XMM0_Dc & uVar13);
                *(uint *)(ptr_01 + uVar10) = uVar2;
                *(uint *)((long)(ptr_01 + uVar10) + 4) = uVar42;
                a_00[1] = a[1];
                a_00[0] = (longlong)ppVar11;
                b_01[1] = b_00[1];
                alVar45 = _mm_cmpgt_epi64_rpl(a_00,b_01);
                b_02[0] = alVar45[1];
                a_01[1] = a[1];
                a_01[0] = (longlong)ppVar11;
                b_02[1] = b_00[1];
                alVar45 = _mm_cmplt_epi64_rpl(a_01,b_02);
                b_03[0] = alVar45[1];
                local_1e8._0_4_ = (uint)extraout_XMM0_Qa_00;
                local_1e8._4_4_ = (uint)((ulong)extraout_XMM0_Qa_00 >> 0x20);
                uStack_1e0._0_4_ = (uint)extraout_XMM0_Qb_00;
                uStack_1e0._4_4_ = (uint)((ulong)extraout_XMM0_Qb_00 >> 0x20);
                local_1e8._0_4_ = extraout_XMM0_Da_00 & (uint)local_88 & (uint)local_1e8;
                local_1e8._4_4_ = extraout_XMM0_Db_00 & local_88._4_4_ & local_1e8._4_4_;
                uStack_1e0._0_4_ = extraout_XMM0_Dc_00 & (uint)uStack_80 & (uint)uStack_1e0;
                uStack_1e0._4_4_ = extraout_XMM0_Dd_00 & uStack_80._4_4_ & uStack_1e0._4_4_;
                a_02[1] = a[1];
                a_02[0] = (longlong)ppVar11;
                b_03[1] = b_00[1];
                alVar45 = _mm_cmpeq_epi64_rpl(a_02,b_03);
                b_04[0] = alVar45[1];
                a_03[1] = a[1];
                a_03[0] = (longlong)ppVar11;
                b_04[1] = b_00[1];
                local_68 = extraout_XMM0_Qa_01;
                uStack_60 = extraout_XMM0_Qb_01;
                alVar45 = _mm_cmpgt_epi64_rpl(a_03,b_04);
                b_05[0] = alVar45[1];
                local_78 = extraout_XMM0_Da_01 & (uint)local_1e8;
                uStack_74 = extraout_XMM0_Db_01 & local_1e8._4_4_;
                uStack_70 = extraout_XMM0_Dc_01 & (uint)uStack_1e0;
                uStack_6c = extraout_XMM0_Dd_01 & uStack_1e0._4_4_;
                a_04[1] = a[1];
                a_04[0] = (longlong)ppVar11;
                b_05[1] = b_00[1];
                alVar45 = _mm_cmplt_epi64_rpl(a_04,b_05);
                uVar5 = CONCAT44(uStack_74,local_78);
                uVar21 = CONCAT44(uStack_6c,uStack_70);
                local_1b8 = uVar5 & local_1c8 | ~uVar5 & local_1b8;
                uStack_1b0 = uVar21 & uStack_1c0 | ~uVar21 & uStack_1b0;
                local_68 = extraout_XMM0_Qa_02 & local_1e8 & local_68;
                uStack_60 = extraout_XMM0_Qb_02 & uStack_1e0 & uStack_60;
                local_138 = local_68 & local_178._0_8_ |
                            ~local_68 & (uVar5 & local_178._0_8_ | ~uVar5 & local_138);
                uStack_130 = uStack_60 & local_178._8_8_ |
                             ~uStack_60 & (uVar21 & local_178._8_8_ | ~uVar21 & uStack_130);
                local_198 = local_68 & local_1f8 |
                            ~local_68 & (uVar5 & local_1f8 | ~uVar5 & local_198);
                uStack_190 = uStack_60 & uStack_1f0 |
                             ~uStack_60 & (uVar21 & uStack_1f0 | ~uVar21 & uStack_190);
                local_1f8 = local_1f8 + 1;
                uStack_1f0 = uStack_1f0 + 1;
                uVar10 = uVar10 + 1;
                uVar5 = local_58;
                uVar21 = uStack_50;
              }
              local_178._8_8_ = local_178._8_8_ + 2;
              local_178._0_8_ = local_178._0_8_ + 2;
              uVar5 = local_128[3] + 2;
            }
            local_48[0] = local_1b8;
            local_48[1] = uStack_1b0;
            local_e8[0] = local_198;
            local_e8[1] = uStack_190;
            local_128[0] = local_138;
            local_128[1] = uStack_130;
            iVar7 = 0;
            iVar35 = 0;
            for (lVar4 = 0; (int)lVar4 != 2; lVar4 = lVar4 + 1) {
              uVar8 = local_48[lVar4];
              if ((long)uVar12 < (long)uVar8) {
                iVar35 = (int)local_128[lVar4];
                uVar12 = uVar8;
                iVar7 = (int)local_e8[lVar4];
              }
              else if (uVar8 == uVar12) {
                uVar5 = local_e8[lVar4];
                if ((long)uVar5 < (long)iVar7) {
                  iVar35 = (int)local_128[lVar4];
                  iVar7 = (int)uVar5;
                }
                else if ((uVar5 == (long)iVar7) &&
                        (a[1] = local_128[lVar4], (long)a[1] < (long)iVar35)) {
                  iVar35 = (int)a[1];
                  iVar7 = (int)uVar5;
                }
              }
              b_00[1] = uVar12;
            }
            a_05[1] = a[1];
            a_05[0] = (longlong)matrix;
            b_06[1] = b_00[1];
            b_06[0] = uVar5;
            ppVar11 = matrix;
            alVar45 = _mm_cmplt_epi64_rpl(a_05,b_06);
            b_07[0] = alVar45[1];
            a_06[1] = a[1];
            a_06[0] = (longlong)ppVar11;
            b_07[1] = b_00[1];
            _mm_cmpgt_epi64_rpl(a_06,b_07);
            iVar37 = (int)uVar12;
            auVar14._8_8_ = extraout_XMM0_Qb_03;
            auVar14._0_8_ = extraout_XMM0_Qa_03;
            auVar14 = extraout_XMM0 | auVar14;
            if ((((((((((((((((auVar14 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar14 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar14 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar14 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar14 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar14 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar14 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar14 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar14 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar14 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar14 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar14 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar14 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar14 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar14 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar14[0xf] < '\0') {
              *(byte *)&ppVar3->flag = (byte)ppVar3->flag | 0x40;
              iVar37 = 0;
              iVar7 = 0;
              iVar35 = 0;
            }
            ppVar3->score = iVar37;
            ppVar3->end_query = iVar35;
            ppVar3->end_ref = iVar7;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_210);
              return ppVar3;
            }
            return ppVar3;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar6 = "_s1";
      }
      else {
        b_00[1] = (ulong)(uint)_s1Len;
        if (0 < _s1Len) goto LAB_0050c441;
        __format = "%s: %s must be > 0\n";
        pcVar6 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_diag_sse2_128_64",pcVar6);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vNH, vOpen),
                    _mm_sub_epi64(vF, vGap));
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vWH, vOpen),
                    _mm_sub_epi64(vE, vGap));
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            vWH = _mm_max_epi64_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi64_rpl(vJ, vNegOne),
                        _mm_cmplt_epi64_rpl(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi64_rpl(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}